

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_DecompressFastArgs_init
                 (HUF_DecompressFastArgs *args,void *dst,size_t dstSize,void *src,size_t srcSize,
                 HUF_DTable *DTable)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  ushort uVar4;
  ushort uVar5;
  size_t sVar6;
  BYTE *ip;
  BYTE *pBVar7;
  ulong uVar8;
  BYTE *istart;
  
  if (srcSize < 10) {
    return 0xffffffffffffffec;
  }
  if (*(char *)((long)DTable + 2) == '\v') {
    uVar8 = (ulong)*src;
    uVar4 = *(ushort *)((long)src + 2);
    uVar5 = *(ushort *)((long)src + 4);
    pBVar1 = (BYTE *)((long)src + 6) + uVar8;
    pBVar2 = pBVar1 + uVar4;
    pBVar3 = pBVar2 + uVar5;
    args->iend[0] = (BYTE *)((long)src + 6);
    args->iend[1] = pBVar1;
    args->iend[2] = pBVar2;
    args->iend[3] = pBVar3;
    if (uVar8 < 0x10) {
      return 0;
    }
    if (uVar4 < 8) {
      return 0;
    }
    if (uVar5 < 8) {
      return 0;
    }
    uVar8 = uVar8 + uVar4 + (ulong)uVar5 + 6;
    if (srcSize - uVar8 < 8) {
      return 0;
    }
    if (srcSize < uVar8) {
      return 0xffffffffffffffec;
    }
    args->ip[0] = pBVar1 + -8;
    args->ip[1] = pBVar2 + -8;
    args->ip[2] = pBVar3 + -8;
    ip = (BYTE *)((long)src + (srcSize - 8));
    args->ip[3] = ip;
    args->op[0] = (BYTE *)dst;
    uVar8 = dstSize + 3 >> 2;
    args->op[1] = (BYTE *)((long)dst + uVar8);
    pBVar7 = (BYTE *)((long)dst + uVar8) + uVar8;
    args->op[2] = pBVar7;
    args->op[3] = pBVar7 + uVar8;
    if (pBVar7 + uVar8 < (BYTE *)((long)dst + dstSize)) {
      sVar6 = HUF_initFastDStream(pBVar1 + -8);
      args->bits[0] = sVar6;
      sVar6 = HUF_initFastDStream(pBVar2 + -8);
      args->bits[1] = sVar6;
      sVar6 = HUF_initFastDStream(pBVar3 + -8);
      args->bits[2] = sVar6;
      sVar6 = HUF_initFastDStream(ip);
      args->bits[3] = sVar6;
      args->ilimit = (BYTE *)((long)src + 0xe);
      args->oend = (BYTE *)((long)dst + dstSize);
      args->dt = DTable + 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

static size_t HUF_DecompressFastArgs_init(HUF_DecompressFastArgs* args, void* dst, size_t dstSize, void const* src, size_t srcSize, const HUF_DTable* DTable)
{
    void const* dt = DTable + 1;
    U32 const dtLog = HUF_getDTableDesc(DTable).tableLog;

    const BYTE* const ilimit = (const BYTE*)src + 6 + 8;

    BYTE* const oend = (BYTE*)dst + dstSize;

    /* The fast decoding loop assumes 64-bit little-endian.
     * This condition is false on x32.
     */
    if (!MEM_isLittleEndian() || MEM_32bits())
        return 0;

    /* strict minimum : jump table + 1 byte per stream */
    if (srcSize < 10)
        return ERROR(corruption_detected);

    /* Must have at least 8 bytes per stream because we don't handle initializing smaller bit containers.
     * If table log is not correct at this point, fallback to the old decoder.
     * On small inputs we don't have enough data to trigger the fast loop, so use the old decoder.
     */
    if (dtLog != HUF_DECODER_FAST_TABLELOG)
        return 0;

    /* Read the jump table. */
    {
        const BYTE* const istart = (const BYTE*)src;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = srcSize - (length1 + length2 + length3 + 6);
        args->iend[0] = istart + 6;  /* jumpTable */
        args->iend[1] = args->iend[0] + length1;
        args->iend[2] = args->iend[1] + length2;
        args->iend[3] = args->iend[2] + length3;

        /* HUF_initFastDStream() requires this, and this small of an input
         * won't benefit from the ASM loop anyways.
         * length1 must be >= 16 so that ip[0] >= ilimit before the loop
         * starts.
         */
        if (length1 < 16 || length2 < 8 || length3 < 8 || length4 < 8)
            return 0;
        if (length4 > srcSize) return ERROR(corruption_detected);   /* overflow */
    }
    /* ip[] contains the position that is currently loaded into bits[]. */
    args->ip[0] = args->iend[1] - sizeof(U64);
    args->ip[1] = args->iend[2] - sizeof(U64);
    args->ip[2] = args->iend[3] - sizeof(U64);
    args->ip[3] = (BYTE const*)src + srcSize - sizeof(U64);

    /* op[] contains the output pointers. */
    args->op[0] = (BYTE*)dst;
    args->op[1] = args->op[0] + (dstSize+3)/4;
    args->op[2] = args->op[1] + (dstSize+3)/4;
    args->op[3] = args->op[2] + (dstSize+3)/4;

    /* No point to call the ASM loop for tiny outputs. */
    if (args->op[3] >= oend)
        return 0;

    /* bits[] is the bit container.
        * It is read from the MSB down to the LSB.
        * It is shifted left as it is read, and zeros are
        * shifted in. After the lowest valid bit a 1 is
        * set, so that CountTrailingZeros(bits[]) can be used
        * to count how many bits we've consumed.
        */
    args->bits[0] = HUF_initFastDStream(args->ip[0]);
    args->bits[1] = HUF_initFastDStream(args->ip[1]);
    args->bits[2] = HUF_initFastDStream(args->ip[2]);
    args->bits[3] = HUF_initFastDStream(args->ip[3]);

    /* If ip[] >= ilimit, it is guaranteed to be safe to
        * reload bits[]. It may be beyond its section, but is
        * guaranteed to be valid (>= istart).
        */
    args->ilimit = ilimit;

    args->oend = oend;
    args->dt = dt;

    return 1;
}